

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlBufDumpElementDecl(xmlOutputBufferPtr buf,xmlElementPtr elem)

{
  xmlElementTypeVal xVar1;
  xmlElementContentType xVar2;
  xmlElementContentPtr pxVar3;
  _xmlElementContent *p_Var4;
  uint uVar5;
  char *pcVar6;
  int len;
  xmlElementContentPtr pxVar7;
  _xmlElementContent **pp_Var8;
  bool bVar9;
  
  xmlOutputBufferWrite(buf,10,"<!ELEMENT ");
  if (elem->prefix != (xmlChar *)0x0) {
    xmlOutputBufferWriteString(buf,(char *)elem->prefix);
    xmlOutputBufferWrite(buf,1,":");
  }
  xmlOutputBufferWriteString(buf,(char *)elem->name);
  xmlOutputBufferWrite(buf,1," ");
  xVar1 = elem->etype;
  if (xVar1 - XML_ELEMENT_TYPE_MIXED < 2) {
    pxVar3 = elem->content;
    if (pxVar3 == (xmlElementContentPtr)0x0) goto LAB_00172f12;
    xmlOutputBufferWrite(buf,1,"(");
    pxVar7 = pxVar3;
    do {
      if (pxVar7 == (xmlElementContentPtr)0x0) goto LAB_00172f12;
      xVar2 = pxVar7->type;
      if (xVar2 - XML_ELEMENT_CONTENT_SEQ < 2) {
        if (((pxVar7 != pxVar3) && (pxVar7->parent != (_xmlElementContent *)0x0)) &&
           ((xVar2 != pxVar7->parent->type || (pxVar7->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
          xmlOutputBufferWrite(buf,1,"(");
        }
        pp_Var8 = &pxVar7->c1;
      }
      else {
        if (xVar2 == XML_ELEMENT_CONTENT_PCDATA) {
          xmlOutputBufferWrite(buf,7,"#PCDATA");
        }
        else if (xVar2 == XML_ELEMENT_CONTENT_ELEMENT) {
          if (pxVar7->prefix != (xmlChar *)0x0) {
            xmlOutputBufferWriteString(buf,(char *)pxVar7->prefix);
            xmlOutputBufferWrite(buf,1,":");
          }
          xmlOutputBufferWriteString(buf,(char *)pxVar7->name);
        }
        do {
          if (pxVar7 == pxVar3) goto LAB_00172ec4;
          p_Var4 = pxVar7->parent;
          if (p_Var4 == (_xmlElementContent *)0x0) goto LAB_00172f12;
          if ((pxVar7->type - XML_ELEMENT_CONTENT_SEQ < 2) &&
             ((pxVar7->type != p_Var4->type || (pxVar7->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
            xmlOutputBufferWrite(buf,1,")");
          }
          uVar5 = pxVar7->ocur - XML_ELEMENT_CONTENT_OPT;
          if (uVar5 < 3) {
            xmlOutputBufferWrite(buf,1,*(char **)(&DAT_00212ce0 + (ulong)uVar5 * 8));
          }
          bVar9 = pxVar7 != p_Var4->c1;
          pxVar7 = p_Var4;
        } while (bVar9);
        pcVar6 = " , ";
        if (p_Var4->type == XML_ELEMENT_CONTENT_SEQ) {
LAB_00172ead:
          xmlOutputBufferWrite(buf,3,pcVar6);
        }
        else if (p_Var4->type == XML_ELEMENT_CONTENT_OR) {
          pcVar6 = " | ";
          goto LAB_00172ead;
        }
        pp_Var8 = &p_Var4->c2;
      }
      pxVar7 = *pp_Var8;
LAB_00172ec4:
    } while (pxVar7 != pxVar3);
    xmlOutputBufferWrite(buf,1,")");
    uVar5 = pxVar3->ocur - XML_ELEMENT_CONTENT_OPT;
    if (2 < uVar5) goto LAB_00172f12;
    pcVar6 = *(char **)(&DAT_00212ce0 + (ulong)uVar5 * 8);
    len = 1;
  }
  else if (xVar1 == XML_ELEMENT_TYPE_ANY) {
    pcVar6 = "ANY";
    len = 3;
  }
  else {
    if (xVar1 != XML_ELEMENT_TYPE_EMPTY) goto LAB_00172f12;
    pcVar6 = "EMPTY";
    len = 5;
  }
  xmlOutputBufferWrite(buf,len,pcVar6);
LAB_00172f12:
  xmlOutputBufferWrite(buf,2,">\n");
  return;
}

Assistant:

static void
xmlBufDumpElementDecl(xmlOutputBufferPtr buf, xmlElementPtr elem) {
    xmlOutputBufferWrite(buf, 10, "<!ELEMENT ");
    if (elem->prefix != NULL) {
        xmlOutputBufferWriteString(buf, (const char *) elem->prefix);
        xmlOutputBufferWrite(buf, 1, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *) elem->name);
    xmlOutputBufferWrite(buf, 1, " ");

    switch (elem->etype) {
	case XML_ELEMENT_TYPE_EMPTY:
	    xmlOutputBufferWrite(buf, 5, "EMPTY");
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    xmlOutputBufferWrite(buf, 3, "ANY");
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	case XML_ELEMENT_TYPE_ELEMENT:
	    xmlBufDumpElementContent(buf, elem->content);
	    break;
        default:
            /* assert(0); */
            break;
    }

    xmlOutputBufferWrite(buf, 2, ">\n");
}